

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O3

EbmlElement *
libebml::EbmlElement::FindNextID
          (IOCallback *DataStream,EbmlCallbacks *ClassInfos,uint64 MaxDataSize)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64 uVar4;
  long lVar5;
  EbmlBinary *this;
  undefined **ppuVar6;
  binary *pbVar7;
  long lVar8;
  uint64 uVar9;
  ulong uVar10;
  bool bVar11;
  binary PossibleId [4];
  uint32 _SizeLength;
  uint64 SizeUnknown;
  binary PossibleSize [8];
  byte local_68 [4];
  uint32 local_64;
  uint64 local_60;
  uint64 local_58;
  uint64 local_50;
  uint64 local_48;
  EbmlCallbacks *local_40;
  binary local_38 [8];
  
  local_60 = 0;
  iVar1 = (*DataStream->_vptr_IOCallback[5])();
  uVar2 = (*DataStream->_vptr_IOCallback[2])(DataStream,local_68,1);
  if (uVar2 != 0) {
    uVar10 = (ulong)uVar2;
    uVar2 = 0x80;
    uVar9 = 1;
    local_48 = MaxDataSize;
    local_40 = ClassInfos;
    while( true ) {
      if (uVar9 == 5) {
        return (EbmlElement *)0x0;
      }
      if ((uVar2 & local_68[0]) != 0) break;
      uVar2 = uVar2 >> 1;
      iVar3 = (*DataStream->_vptr_IOCallback[2])(DataStream,local_68 + uVar9,1);
      uVar10 = (ulong)(uint)((int)uVar10 + iVar3);
      bVar11 = uVar9 == uVar10;
      uVar9 = uVar9 + 1;
      if (bVar11) {
        return (EbmlElement *)0x0;
      }
    }
    local_50 = CONCAT44(extraout_var,iVar1);
    iVar1 = (*DataStream->_vptr_IOCallback[5])(DataStream);
    local_58 = CONCAT44(extraout_var_00,iVar1);
    lVar8 = 0;
    do {
      if (lVar8 == 8) {
        return (EbmlElement *)0x0;
      }
      pbVar7 = local_38 + lVar8;
      lVar8 = lVar8 + 1;
      (*DataStream->_vptr_IOCallback[2])(DataStream,pbVar7,1);
      local_64 = (uint32)lVar8;
      uVar4 = ReadCodedSizeValue(local_38,&local_64,&local_60);
    } while (local_64 == 0);
    uVar2 = 0;
    lVar5 = -1;
    do {
      uVar2 = (uint)local_68[lVar5 + 1] | uVar2 << 8;
      lVar5 = lVar5 + 1;
    } while (uVar9 - 1 != lVar5);
    if ((local_40->GlobalId->Length == uVar9) && (local_40->GlobalId->Value == uVar2)) {
      this = (EbmlBinary *)(*local_40->Create)();
      ppuVar6 = (this->super_EbmlElement)._vptr_EbmlElement;
    }
    else {
      this = (EbmlBinary *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      if (this == (EbmlBinary *)0x0) {
        return (EbmlElement *)0x0;
      }
      EbmlBinary::EbmlBinary(this);
      ppuVar6 = &PTR__EbmlBinary_001ce2c8;
      (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlBinary_001ce2c8;
      *(uint *)&this[1].super_EbmlElement._vptr_EbmlElement = uVar2;
      this[1].super_EbmlElement.Size = uVar9;
    }
    (this->super_EbmlElement).SizeLength = (uint32)lVar8;
    (this->super_EbmlElement).Size = uVar4;
    iVar1 = (*((_func_int **)ppuVar6)[7])(this);
    if ((char)iVar1 != '\0') {
      if (uVar4 == local_60) {
        iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[6])(this,1);
        if ((char)iVar1 != '\0') {
LAB_001835ce:
          (this->super_EbmlElement).ElementPosition = local_50;
          (this->super_EbmlElement).SizePosition = local_58;
          return &this->super_EbmlElement;
        }
      }
      else if ((this->super_EbmlElement).Size <= local_48) {
        (*(this->super_EbmlElement)._vptr_EbmlElement[6])(this,0);
        goto LAB_001835ce;
      }
    }
    (*(this->super_EbmlElement)._vptr_EbmlElement[1])(this);
  }
  return (EbmlElement *)0x0;
}

Assistant:

EbmlElement * EbmlElement::FindNextID(IOCallback & DataStream, const EbmlCallbacks & ClassInfos, uint64 MaxDataSize)
{
  binary PossibleId[4];
  int PossibleID_Length = 0;
  binary PossibleSize[8]; // we don't support size stored in more than 64 bits
  uint32 PossibleSizeLength = 0;
  uint64 SizeUnknown = 0;
  uint64 SizeFound = 0;
  bool bElementFound = false;

  binary BitMask;
  uint64 aElementPosition = 0, aSizePosition = 0;
  while (!bElementFound) {
    // read ID
    aElementPosition = DataStream.getFilePointer();
    uint32 ReadSize = 0;
    BitMask = 1 << 7;
    while (1) {
      ReadSize += DataStream.read(&PossibleId[PossibleID_Length], 1);
      if (ReadSize == uint32(PossibleID_Length)) {
        return NULL; // no more data ?
      }
      if (++PossibleID_Length > 4) {
        return NULL; // we don't support element IDs over class D
      }
      if (PossibleId[0] & BitMask) {
        // this is the last octet of the ID
        // check wether that's the one we're looking for
/*      if (PossibleID == EBML_INFO_ID(ClassInfos)) {
          break;
        } else {
          /// \todo This element should be skipped (use a context ?)
        }*/
        bElementFound = true; /// \todo not exactly the one we're looking for
        break;
      }
      BitMask >>= 1;
    }

    // read the data size
    aSizePosition = DataStream.getFilePointer();
    uint32 _SizeLength;
    do {
      if (PossibleSizeLength >= 8)
        // Size is larger than 8 bytes
        return NULL;

      ReadSize += DataStream.read(&PossibleSize[PossibleSizeLength++], 1);
      _SizeLength = PossibleSizeLength;
      SizeFound = ReadCodedSizeValue(&PossibleSize[0], _SizeLength, SizeUnknown);
    } while (_SizeLength == 0);
  }

  EbmlElement *Result = NULL;
  EbmlId PossibleID(PossibleId, PossibleID_Length);
  if (PossibleID == EBML_INFO_ID(ClassInfos)) {
    // the element is the one expected
    Result = &EBML_INFO_CREATE(ClassInfos);
  } else {
    /// \todo find the element in the context
    Result = new (std::nothrow) EbmlDummy(PossibleID);
    if(Result == NULL)
      return NULL;
  }

  Result->SetSizeLength(PossibleSizeLength);

  Result->Size = SizeFound;

  if (!Result->ValidateSize() || (SizeFound != SizeUnknown && MaxDataSize < Result->Size)) {
    delete Result;
    return NULL;
  }

  // check if the size is not all 1s
  if (SizeFound == SizeUnknown) {
    // Size of this element is unknown
    // only possible for Master elements
    if (!Result->SetSizeInfinite()) {
      /// \todo the element is not allowed to be infinite
      delete Result;
      return NULL;
    }
  } else Result->SetSizeInfinite(false);
  Result->ElementPosition = aElementPosition;
  Result->SizePosition = aSizePosition;

  return Result;
}